

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O2

size_type __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  size_type sVar1;
  VIterator puVar2;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      (&this->Set,V);
    return sVar1;
  }
  puVar2 = vfind(this,V);
  return (ulong)(puVar2 !=
                (VIterator)
                ((ulong)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                        super_SmallVectorTemplateBase<unsigned_int,_true>.
                        super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                        Size * 4 +
                (long)(this->Vector).super_SmallVectorImpl<unsigned_int>.
                      super_SmallVectorTemplateBase<unsigned_int,_true>.
                      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                      BeginX));
}

Assistant:

size_type count(const T &V) const {
    if (isSmall()) {
      // Since the collection is small, just do a linear search.
      return vfind(V) == Vector.end() ? 0 : 1;
    } else {
      return Set.count(V);
    }
  }